

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

int lws_ssl_capable_read_no_ssl(lws *wsi,uchar *buf,size_t len)

{
  uint uVar1;
  undefined8 in_RAX;
  uint *puVar2;
  ssize_t sVar3;
  lws_log_cx *cx;
  int iVar4;
  undefined4 uStack_28;
  socklen_t slt;
  
  _uStack_28 = in_RAX;
  puVar2 = (uint *)__errno_location();
  *puVar2 = 0;
  if (wsi->udp == (lws_udp *)0x0) {
    sVar3 = recv((wsi->desc).sockfd,buf,len,0);
  }
  else {
    _uStack_28 = CONCAT44(0x10,uStack_28);
    sVar3 = recvfrom((wsi->desc).sockfd,buf,len,0,(sockaddr *)wsi->udp,&slt);
  }
  uVar1 = *puVar2;
  iVar4 = (int)sVar3;
  if (iVar4 < 0) {
    if (uVar1 == 4) {
      return -4;
    }
    if (uVar1 == 0xb) {
      return -4;
    }
  }
  else if (iVar4 != 0) {
    return iVar4;
  }
  cx = lwsl_wsi_get_cx(wsi);
  _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_ssl_capable_read_no_ssl",
              "error on reading from skt : %d, errno %d",sVar3,(ulong)uVar1);
  return -1;
}

Assistant:

int
lws_ssl_capable_read_no_ssl(struct lws *wsi, unsigned char *buf, size_t len)
{
	int n = 0, en;

	errno = 0;
#if defined(LWS_WITH_UDP)
	if (lws_wsi_is_udp(wsi)) {
		socklen_t slt = sizeof(wsi->udp->sa46);

		n = (int)recvfrom(wsi->desc.sockfd, (char *)buf,
#if defined(WIN32)
				(int)
#endif
				len, 0,
				sa46_sockaddr(&wsi->udp->sa46), &slt);
	} else
#endif
		n = (int)recv(wsi->desc.sockfd, (char *)buf,
#if defined(WIN32)
				(int)
#endif
				len, 0);
	en = LWS_ERRNO;
	if (n >= 0) {

		if (!n && wsi->unix_skt)
			goto do_err;

		/*
		 * See https://libwebsockets.org/
		 * pipermail/libwebsockets/2019-March/007857.html
		 */
		if (!n && !wsi->unix_skt)
			goto do_err;

#if defined(LWS_WITH_SYS_METRICS) && defined(LWS_WITH_SERVER)
		if (wsi->a.vhost)
			lws_metric_event(wsi->a.vhost->mt_traffic_rx,
					 METRES_GO /* rx */, (unsigned int)n);
#endif

		return n;
	}

	if (en == LWS_EAGAIN ||
	    en == LWS_EWOULDBLOCK ||
	    en == LWS_EINTR)
		return LWS_SSL_CAPABLE_MORE_SERVICE;

do_err:
#if defined(LWS_WITH_SYS_METRICS) && defined(LWS_WITH_SERVER)
	if (wsi->a.vhost)
		lws_metric_event(wsi->a.vhost->mt_traffic_rx, METRES_NOGO, 0u);
#endif

	lwsl_wsi_info(wsi, "error on reading from skt : %d, errno %d", n, en);

	return LWS_SSL_CAPABLE_ERROR;
}